

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O1

int libssh2_userauth_password_ex
              (LIBSSH2_SESSION *session,char *username,uint username_len,char *password,
              uint password_len,
              _func_void_LIBSSH2_SESSION_ptr_char_ptr_ptr_int_ptr_void_ptr_ptr *passwd_change_cb)

{
  int iVar1;
  time_t start_time;
  uchar *puVar2;
  char *errmsg;
  ulong data2_len;
  uchar *local_90;
  uchar **local_88;
  size_t *local_80;
  _func_void_LIBSSH2_SESSION_ptr_char_ptr_ptr_int_ptr_void_ptr_ptr *local_78;
  ulong local_70;
  char *local_68;
  uchar *local_60;
  ulong local_58;
  int *local_50;
  char **local_48;
  packet_requirev_state_t *local_40;
  ulong local_38;
  
  data2_len = (ulong)password_len;
  local_78 = passwd_change_cb;
  local_68 = username;
  local_60 = (uchar *)password;
  start_time = time((time_t *)0x0);
  local_88 = &session->userauth_pswd_data;
  local_80 = &session->userauth_pswd_data_len;
  local_40 = &session->userauth_pswd_packet_requirev_state;
  local_48 = &session->userauth_pswd_newpw;
  local_50 = &session->userauth_pswd_newpw_len;
  local_58 = (ulong)(username_len + password_len + 0x2c);
  local_70 = (ulong)username_len;
  local_38 = data2_len;
  do {
    if (session->userauth_pswd_state == libssh2_NB_state_idle) {
      (session->userauth_pswd_packet_requirev_state).start = 0;
      session->userauth_pswd_data_len = (ulong)(username_len + 0x28);
      session->userauth_pswd_data0 = 0xc3;
      puVar2 = (uchar *)(*session->alloc)((ulong)(username_len + 0x28),&session->abstract);
      session->userauth_pswd_data = puVar2;
      if (puVar2 != (uchar *)0x0) {
        local_90 = puVar2 + 1;
        *puVar2 = '2';
        _libssh2_store_str(&local_90,local_68,local_70);
        _libssh2_store_str(&local_90,"ssh-connection",0xe);
        _libssh2_store_str(&local_90,"password",8);
        *local_90 = '\0';
        local_90 = local_90 + 1;
        _libssh2_store_u32(&local_90,(uint32_t)local_38);
        session->userauth_pswd_state = libssh2_NB_state_created;
        goto LAB_00129109;
      }
      iVar1 = -6;
      errmsg = "Unable to allocate memory for userauth-password request";
      local_90 = (uchar *)0x0;
    }
    else {
LAB_00129109:
      if (session->userauth_pswd_state == libssh2_NB_state_created) {
        iVar1 = _libssh2_transport_send
                          (session,session->userauth_pswd_data,session->userauth_pswd_data_len,
                           local_60,data2_len);
        if (iVar1 == -0x25) {
          iVar1 = -0x25;
          errmsg = "Would block writing password request";
        }
        else {
          (*session->free)(session->userauth_pswd_data,&session->abstract);
          session->userauth_pswd_data = (uchar *)0x0;
          if (iVar1 == 0) {
            session->userauth_pswd_state = libssh2_NB_state_sent;
            goto LAB_001291ad;
          }
          session->userauth_pswd_state = libssh2_NB_state_idle;
          iVar1 = -7;
          errmsg = "Unable to send userauth-password request";
        }
      }
      else {
LAB_001291ad:
        if (session->userauth_pswd_state - libssh2_NB_state_sent < 3) {
          if (session->userauth_pswd_state != libssh2_NB_state_sent) goto LAB_001292b9;
          while (iVar1 = _libssh2_packet_requirev
                                   (session,"43<",local_88,local_80,0,(uchar *)0x0,0,local_40),
                iVar1 != -0x25) {
            if (iVar1 != 0) {
              session->userauth_pswd_state = libssh2_NB_state_idle;
              break;
            }
            if (*local_80 == 0) {
LAB_001294ad:
              session->userauth_pswd_state = libssh2_NB_state_idle;
              iVar1 = -0xe;
              errmsg = "Unexpected packet size";
              goto LAB_00129479;
            }
            puVar2 = *local_88;
            if (*puVar2 == '3') {
              (*session->free)(puVar2,&session->abstract);
              session->userauth_pswd_data = (uchar *)0x0;
              session->userauth_pswd_state = libssh2_NB_state_idle;
              iVar1 = -0x12;
              errmsg = "Authentication failed (username/password)";
              goto LAB_00129479;
            }
            if (*puVar2 == '4') {
              (*session->free)(puVar2,&session->abstract);
              session->userauth_pswd_data = (uchar *)0x0;
              *(byte *)&session->state = (byte)session->state | 4;
              session->userauth_pswd_state = libssh2_NB_state_idle;
              iVar1 = 0;
              goto LAB_0012947e;
            }
            session->userauth_pswd_newpw = (char *)0x0;
            session->userauth_pswd_newpw_len = 0;
            session->userauth_pswd_state = libssh2_NB_state_sent1;
LAB_001292b9:
            if (*local_80 == 0) goto LAB_001294ad;
            puVar2 = *local_88;
            if ((*puVar2 != '<') && (session->userauth_pswd_data0 != '<')) goto LAB_00129446;
            session->userauth_pswd_data0 = '<';
            if ((session->userauth_pswd_state & ~libssh2_NB_state_allocated) !=
                libssh2_NB_state_sent1) {
              session->userauth_pswd_state = libssh2_NB_state_idle;
              iVar1 = -0xf;
              errmsg = "Password Expired, and no callback specified";
              goto LAB_00129479;
            }
            if (session->userauth_pswd_state == libssh2_NB_state_sent1) {
              (*session->free)(puVar2,&session->abstract);
              session->userauth_pswd_data = (uchar *)0x0;
            }
            if (local_78 == (_func_void_LIBSSH2_SESSION_ptr_char_ptr_ptr_int_ptr_void_ptr_ptr *)0x0)
            goto LAB_00129446;
            if (session->userauth_pswd_state == libssh2_NB_state_sent1) {
              (*local_78)(session,local_48,local_50,&session->abstract);
              if (session->userauth_pswd_newpw == (char *)0x0) {
                iVar1 = -0xf;
                errmsg = "Password expired, and callback failed";
                goto LAB_00129479;
              }
              session->userauth_pswd_data_len = local_58;
              local_90 = (uchar *)(*session->alloc)(local_58,&session->abstract);
              session->userauth_pswd_data = local_90;
              if (local_90 == (uchar *)0x0) {
                (*session->free)(session->userauth_pswd_newpw,&session->abstract);
                session->userauth_pswd_newpw = (char *)0x0;
                iVar1 = -6;
                errmsg = "Unable to allocate memory for userauth password change request";
                goto LAB_00129479;
              }
              *local_90 = '2';
              local_90 = local_90 + 1;
              _libssh2_store_str(&local_90,local_68,local_70);
              _libssh2_store_str(&local_90,"ssh-connection",0xe);
              _libssh2_store_str(&local_90,"password",8);
              *local_90 = '\x01';
              local_90 = local_90 + 1;
              _libssh2_store_str(&local_90,(char *)local_60,data2_len);
              _libssh2_store_u32(&local_90,session->userauth_pswd_newpw_len);
              session->userauth_pswd_state = libssh2_NB_state_sent2;
            }
            if (session->userauth_pswd_state != libssh2_NB_state_sent2) goto LAB_00129446;
            iVar1 = _libssh2_transport_send
                              (session,session->userauth_pswd_data,session->userauth_pswd_data_len,
                               (uchar *)session->userauth_pswd_newpw,
                               (long)session->userauth_pswd_newpw_len);
            if (iVar1 == -0x25) {
              iVar1 = -0x25;
              errmsg = "Would block waiting";
              goto LAB_00129479;
            }
            (*session->free)(session->userauth_pswd_data,&session->abstract);
            session->userauth_pswd_data = (uchar *)0x0;
            (*session->free)(session->userauth_pswd_newpw,&session->abstract);
            session->userauth_pswd_newpw = (char *)0x0;
            if (iVar1 != 0) {
              iVar1 = -7;
              errmsg = "Unable to send userauth password-change request";
              goto LAB_00129479;
            }
            session->userauth_pswd_state = libssh2_NB_state_sent;
          }
          errmsg = "Waiting for password response";
        }
        else {
LAB_00129446:
          (*session->free)(session->userauth_pswd_data,&session->abstract);
          session->userauth_pswd_data = (uchar *)0x0;
          session->userauth_pswd_state = libssh2_NB_state_idle;
          iVar1 = -0x12;
          errmsg = "Authentication failed";
        }
      }
    }
LAB_00129479:
    iVar1 = _libssh2_error(session,iVar1,errmsg);
LAB_0012947e:
    if (iVar1 != -0x25) {
      return iVar1;
    }
    if (session->api_block_mode == 0) {
      return -0x25;
    }
    iVar1 = _libssh2_wait_socket(session,start_time);
    if (iVar1 != 0) {
      return iVar1;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_userauth_password_ex(LIBSSH2_SESSION *session, const char *username,
                             unsigned int username_len, const char *password,
                             unsigned int password_len,
                             LIBSSH2_PASSWD_CHANGEREQ_FUNC
                             ((*passwd_change_cb)))
{
    int rc;
    BLOCK_ADJUST(rc, session,
                 userauth_password(session, username, username_len,
                                   (unsigned char *)password, password_len,
                                   passwd_change_cb));
    return rc;
}